

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::check_collapse_exposure
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes,Int cell_dim)

{
  int *piVar1;
  Alloc *pAVar2;
  byte bVar3;
  int iVar4;
  Alloc *pAVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  byte bVar10;
  void *extraout_RDX;
  element_type *peVar11;
  uint uVar12;
  char cVar13;
  uint uVar14;
  LO size_in;
  uint uVar15;
  int iVar16;
  size_t sVar17;
  undefined4 *puVar18;
  bool bVar19;
  Read<signed_char> RVar20;
  Write<signed_char> cand_codes_w;
  LOs cs2s;
  Read<signed_char> ec_codes;
  LOs ec2c;
  LOs e2ec;
  Read<signed_char> s2dim;
  Read<signed_char> c2dim;
  type f;
  Adj e2c;
  int local_32c;
  Write<signed_char> local_328;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_318;
  Alloc *local_310;
  element_type *local_308;
  Alloc *local_300;
  Alloc *local_2f8;
  Alloc *local_2f0;
  Alloc *local_2e8;
  Alloc *local_2e0;
  Alloc *local_2d8;
  Alloc *local_2d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c8;
  Alloc *local_2c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b8;
  element_type *local_2b0;
  Alloc *local_2a8;
  Alloc *local_2a0;
  Write<signed_char> local_298;
  undefined1 local_288 [32];
  Alloc *local_268;
  Alloc *local_260;
  Alloc *local_258;
  Alloc *local_250;
  Alloc *local_248;
  Alloc *local_240;
  Alloc *local_238;
  element_type *local_230;
  Int local_228;
  Alloc *local_220;
  element_type *local_218;
  int local_210;
  Alloc *local_208;
  element_type *local_200;
  Alloc *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  Alloc *local_1e8;
  element_type *local_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  element_type *local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  Alloc *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  Alloc *local_1a8;
  Alloc *local_1a0;
  Alloc *local_198;
  Alloc *local_190;
  Alloc *local_188;
  Alloc *local_180;
  Alloc *local_178;
  element_type *local_170;
  Int local_168;
  Alloc *local_160;
  element_type *local_158;
  int local_150;
  Alloc *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  Alloc *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  element_type *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  element_type *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  Alloc *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  Alloc *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  Alloc *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  Alloc *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  Alloc *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  Alloc *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  Int local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  element_type *peStack_98;
  int local_90;
  Alloc *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  Alloc *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  Adj local_60;
  
  local_2d0 = (Alloc *)this;
  Mesh::ask_up(&local_60,mesh,1,cell_dim);
  local_2e0 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2e0 = (Alloc *)((long)(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_2d8 = (Alloc *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_2f0 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2f0 = (Alloc *)((long)(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_2e8 = (Alloc *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_300 = local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_300 = (Alloc *)((local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.codes.write_.shared_alloc_.alloc)->use_count =
           (local_60.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2f8 = (Alloc *)local_60.codes.write_.shared_alloc_.direct_ptr;
  uVar8 = cell_dim - 1;
  Mesh::ask_down((Adj *)local_288,mesh,cell_dim,uVar8);
  pAVar2 = (Alloc *)(local_288 + 0x10);
  local_310 = (Alloc *)local_288._16_8_;
  local_308 = (element_type *)local_288._24_8_;
  if (((local_288._16_8_ & 7) == 0 && (Alloc *)local_288._16_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_288._16_8_ + 0x30) = *(int *)(local_288._16_8_ + 0x30) + -1;
    local_310 = (Alloc *)(*(long *)local_288._16_8_ * 8 + 1);
  }
  local_288._16_8_ = (Alloc *)0x0;
  local_288._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Adj::~Adj((Adj *)local_288);
  switch(cell_dim) {
  case 0:
    local_32c = 1;
    break;
  case 1:
    if (uVar8 == 0) {
      local_32c = 2;
      break;
    }
    bVar19 = uVar8 == 1;
    goto LAB_00244c60;
  case 2:
    local_32c = 3;
    bVar19 = uVar8 == 2;
    if (uVar8 < 2) break;
LAB_00244c60:
    local_32c = (uint)bVar19 * 2 + -1;
    break;
  case 3:
    local_32c = 4;
    break;
  default:
    local_32c = -1;
  }
  local_288._0_8_ = pAVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"class_dim","");
  Mesh::get_array<signed_char>((Mesh *)&local_1d8,(Int)mesh,(string *)(ulong)(uint)cell_dim);
  if ((Alloc *)local_288._0_8_ != pAVar2) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  local_288._0_8_ = pAVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"class_dim","");
  Mesh::get_array<signed_char>((Mesh *)&local_1e8,(Int)mesh,(string *)(ulong)uVar8);
  if ((Alloc *)local_288._0_8_ != pAVar2) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  pAVar5 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 1) == 0) {
    sVar17 = pAVar5->size;
  }
  else {
    sVar17 = (ulong)pAVar5 >> 3;
  }
  local_288._0_8_ = pAVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
  size_in = (LO)(element_type *)(sVar17 >> 2);
  Write<signed_char>::Write(&local_328,size_in,(string *)local_288);
  if ((Alloc *)local_288._0_8_ != pAVar2) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  local_1c8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(cand_codes->write_).shared_alloc_.alloc;
  if (((ulong)local_1c8._M_pi & 7) == 0 && (Alloc *)local_1c8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (((Alloc *)local_1c8._M_pi)->size * 8 + 1);
    }
    else {
      ((Alloc *)local_1c8._M_pi)->use_count = ((Alloc *)local_1c8._M_pi)->use_count + 1;
    }
  }
  local_318 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (cand_codes->write_).shared_alloc_.direct_ptr;
  local_1b8 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (Alloc *)(local_1b8->size * 8 + 1);
    }
    else {
      local_1b8->use_count = local_1b8->use_count + 1;
    }
  }
  local_2b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (cands2edges->write_).shared_alloc_.direct_ptr;
  local_1a8 = local_2e0;
  if (((ulong)local_2e0 & 7) == 0 && local_2e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)(local_2e0->size * 8 + 1);
    }
    else {
      local_2e0->use_count = local_2e0->use_count + 1;
    }
  }
  local_1a0 = local_2d8;
  local_198 = local_2f0;
  if (((ulong)local_2f0 & 7) == 0 && local_2f0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198 = (Alloc *)(local_2f0->size * 8 + 1);
    }
    else {
      local_2f0->use_count = local_2f0->use_count + 1;
    }
  }
  local_190 = local_2e8;
  local_188 = local_300;
  if (((ulong)local_300 & 7) == 0 && local_300 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188 = (Alloc *)(local_300->size * 8 + 1);
    }
    else {
      local_300->use_count = local_300->use_count + 1;
    }
  }
  local_180 = local_2f8;
  local_178 = (Alloc *)local_1d8._M_pi;
  if (((ulong)local_1d8._M_pi & 7) == 0 && (Alloc *)local_1d8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178 = (Alloc *)((long)(local_1d8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_1d8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_1d8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_170 = local_1d0;
  local_160 = local_310;
  if (((ulong)local_310 & 7) == 0 && local_310 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_160 = (Alloc *)(local_310->size * 8 + 1);
    }
    else {
      local_310->use_count = local_310->use_count + 1;
    }
  }
  local_158 = local_308;
  local_150 = local_32c;
  local_148 = local_1e8;
  if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148 = (Alloc *)(local_1e8->size * 8 + 1);
    }
    else {
      local_1e8->use_count = local_1e8->use_count + 1;
    }
  }
  local_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0;
  local_138 = local_328.shared_alloc_.alloc;
  if (((ulong)local_328.shared_alloc_.alloc & 7) == 0 &&
      local_328.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138 = (Alloc *)((local_328.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_328.shared_alloc_.alloc)->use_count = (local_328.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_130._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.shared_alloc_.direct_ptr;
  local_108 = (Alloc *)local_1c8._M_pi;
  if (((ulong)local_1c8._M_pi & 7) == 0 && (Alloc *)local_1c8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)((long)(local_1c8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_1c8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_1c8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_f8 = local_1b8;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (Alloc *)(local_1b8->size * 8 + 1);
    }
    else {
      local_1b8->use_count = local_1b8->use_count + 1;
    }
  }
  local_e8 = local_1a8;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    else {
      local_1a8->use_count = local_1a8->use_count + 1;
    }
  }
  local_2c0 = local_2d8;
  _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8;
  local_d8 = local_198;
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)(local_198->size * 8 + 1);
    }
    else {
      local_198->use_count = local_198->use_count + 1;
    }
  }
  local_2a0 = local_2e8;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8;
  local_c8 = local_188;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  local_2a8 = local_2f8;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8;
  local_b8 = local_178;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)(local_178->size * 8 + 1);
    }
    else {
      local_178->use_count = local_178->use_count + 1;
    }
  }
  local_2b0 = local_1d0;
  _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0;
  local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160;
  if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_160->size * 8 + 1);
    }
    else {
      local_160->use_count = local_160->use_count + 1;
    }
  }
  peStack_98 = local_308;
  local_90 = local_32c;
  local_88 = local_148;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(local_148->size * 8 + 1);
    }
    else {
      local_148->use_count = local_148->use_count + 1;
    }
  }
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0;
  local_78 = local_138;
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_138->size * 8 + 1);
    }
    else {
      local_138->use_count = local_138->use_count + 1;
    }
  }
  local_2c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.shared_alloc_.direct_ptr;
  _Stack_70._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.shared_alloc_.direct_ptr;
  local_1c0 = local_318;
  local_1b0 = local_2b8;
  local_168 = cell_dim;
  _Stack_100._M_pi = local_318;
  _Stack_f0._M_pi = local_2b8;
  local_a8 = cell_dim;
  if (0 < size_in) {
    local_288._0_8_ = local_108;
    if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
      local_108->use_count = local_108->use_count + -1;
      local_288._0_8_ = local_108->size * 8 + 1;
    }
    local_108 = (Alloc *)0x0;
    _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_288._16_8_ = local_f8;
    if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
      local_f8->use_count = local_f8->use_count + -1;
      local_288._16_8_ = local_f8->size * 8 + 1;
    }
    local_f8 = (Alloc *)0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_268 = local_e8;
    local_260 = local_2d8;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      local_e8->use_count = local_e8->use_count + -1;
      local_268 = (Alloc *)(local_e8->size * 8 + 1);
    }
    local_e8 = (Alloc *)0x0;
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_258 = local_d8;
    local_250 = local_2e8;
    if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
      local_d8->use_count = local_d8->use_count + -1;
      local_258 = (Alloc *)(local_d8->size * 8 + 1);
    }
    local_d8 = (Alloc *)0x0;
    _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_248 = local_c8;
    local_240 = local_2f8;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_c8->use_count = local_c8->use_count + -1;
      local_248 = (Alloc *)(local_c8->size * 8 + 1);
    }
    local_c8 = (Alloc *)0x0;
    _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_238 = local_b8;
    local_230 = local_1d0;
    if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
      local_b8->use_count = local_b8->use_count + -1;
      local_238 = (Alloc *)(local_b8->size * 8 + 1);
    }
    local_b8 = (Alloc *)0x0;
    _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_220 = (Alloc *)local_a0._M_pi;
    local_218 = local_308;
    if (((ulong)local_a0._M_pi & 7) == 0 && (Alloc *)local_a0._M_pi != (Alloc *)0x0) {
      *(int *)&local_a0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_a0._M_pi[3]._vptr__Sp_counted_base + -1;
      local_220 = (Alloc *)((long)(local_a0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_98 = (element_type *)0x0;
    local_210 = local_32c;
    local_208 = local_88;
    local_200 = local_1e0;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      local_88->use_count = local_88->use_count + -1;
      local_208 = (Alloc *)(local_88->size * 8 + 1);
    }
    local_88 = (Alloc *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8 = local_78;
    local_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.shared_alloc_.direct_ptr;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      local_78->use_count = local_78->use_count + -1;
      local_1f8 = (Alloc *)(local_78->size * 8 + 1);
    }
    local_78 = (Alloc *)0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    entering_parallel = '\0';
    p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      local_120._M_pi = p_Var9;
      bVar10 = *(byte *)((long)&(local_120._M_pi)->_vptr__Sp_counted_base +
                        (long)&local_318->_vptr__Sp_counted_base);
      lVar6 = (long)*(int *)((long)&local_2b8->_vptr__Sp_counted_base + (long)local_120._M_pi * 4);
      iVar4 = *(int *)((long)&(((Graph *)&local_2d8->size)->a2ab).write_.shared_alloc_.alloc +
                      lVar6 * 4);
      iVar16 = *(int *)((long)&(((Graph *)&local_2d8->size)->a2ab).write_.shared_alloc_.alloc +
                       lVar6 * 4 + 4);
      local_118 = (element_type *)(long)iVar16;
      peVar11 = (element_type *)(long)iVar4;
      if (iVar4 < iVar16) {
        do {
          local_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar11;
          iVar4 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                    *)&local_2e8->size)->_M_ptr + (long)local_110._M_pi * 4);
          bVar3 = *(byte *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)&local_2f8->size)->_M_ptr +
                           (long)&(((element_type *)local_110._M_pi)->super_Graph).a2ab.write_);
          cVar13 = (char)bVar3 >> 3;
          uVar12 = bVar3 >> 1 & 3;
          uVar8 = 0;
          uVar14 = 1;
          do {
            if (((uint)(int)(char)bVar10 >> (uVar8 & 0x1f) & 1) == 0) goto LAB_00245811;
            uVar15 = uVar14 ^ uVar12;
            uVar7 = 0xffffffff;
            if (cell_dim == 2) {
              if (cVar13 == '\x02') {
switchD_00245731_caseD_2:
                uVar7 = 2;
                if (uVar12 != uVar14) {
                  uVar7 = (ulong)-(uint)(uVar15 != 1);
                }
              }
              else {
                if (cVar13 == '\x01') goto switchD_00245731_caseD_1;
                if (cVar13 == '\0') goto switchD_00245731_caseD_0;
              }
              goto switchD_00245731_default;
            }
            if (cell_dim != 3) goto switchD_00245731_default;
            switch(cVar13) {
            case '\0':
switchD_00245731_caseD_0:
              if (uVar12 == uVar14) {
LAB_0024574e:
                uVar7 = 0;
              }
              else {
                uVar7 = (ulong)((uint)(uVar15 == 1) * 2 - 1);
              }
              break;
            case '\x01':
switchD_00245731_caseD_1:
              uVar7 = 1;
              if (uVar12 != uVar14) {
                uVar7 = (ulong)((uint)(uVar15 == 1) * 3 - 1);
              }
              break;
            case '\x02':
              goto switchD_00245731_caseD_2;
            case '\x03':
              if (uVar12 == uVar14) goto LAB_0024574e;
              goto LAB_002457a6;
            case '\x04':
              uVar7 = 1;
              goto LAB_002457a1;
            case '\x05':
              uVar7 = 2;
LAB_002457a1:
              if (uVar12 != uVar14) {
LAB_002457a6:
                uVar7 = (ulong)((uint)(uVar15 == 1) * 4 - 1);
              }
            }
switchD_00245731_default:
            uVar15 = (uint)uVar7;
            if (cell_dim == 1) {
              iVar16 = 1 - uVar15;
            }
            else {
              iVar16 = -1;
              if (cell_dim == 2) {
                if (uVar15 < 3) {
                  puVar18 = &DAT_0044ebc4;
                  goto LAB_002457ec;
                }
              }
              else if ((cell_dim == 3) && (uVar15 < 4)) {
                puVar18 = &DAT_00450cf8;
LAB_002457ec:
                iVar16 = puVar18[uVar7];
              }
            }
            if (*(char *)((long)&local_1e0->library_ +
                         (long)*(int *)((long)&(local_308->super_Graph).a2ab.write_.shared_alloc_.
                                               alloc + (long)(iVar16 + iVar4 * local_32c) * 4)) !=
                *(char *)((long)&local_1d0->library_ + (long)iVar4)) {
              bVar10 = bVar10 & ~(byte)(1 << ((byte)uVar8 & 0x1f));
            }
LAB_00245811:
            uVar8 = uVar8 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar14 == 0);
          peVar11 = (element_type *)
                    ((long)&(((element_type *)local_110._M_pi)->super_Graph).a2ab.write_.
                            shared_alloc_.alloc + 1);
        } while (peVar11 != local_118);
      }
      *(byte *)((long)&(local_120._M_pi)->_vptr__Sp_counted_base +
               (long)(_func_int ***)local_328.shared_alloc_.direct_ptr) = bVar10;
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_120._M_pi)->_vptr__Sp_counted_base + 1);
    } while ((int)p_Var9 != size_in);
    local_288._8_8_ = local_318;
    local_288._24_8_ = local_2b8;
    local_228 = cell_dim;
    local_128 = (element_type *)(sVar17 >> 2);
    check_collapse_exposure(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int)::$_0::
    ~__0((__0 *)local_288);
  }
  check_collapse_exposure(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int)::$_0::
  ~__0((__0 *)&local_108);
  local_298.shared_alloc_.alloc = local_328.shared_alloc_.alloc;
  local_298.shared_alloc_.direct_ptr = local_328.shared_alloc_.direct_ptr;
  if ((((ulong)local_328.shared_alloc_.alloc & 7) == 0 &&
       local_328.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_328.shared_alloc_.alloc)->use_count = (local_328.shared_alloc_.alloc)->use_count + -1;
    local_298.shared_alloc_.alloc = (Alloc *)((local_328.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_328.shared_alloc_.alloc = (Alloc *)0x0;
  local_328.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)local_2d0,&local_298);
  pAVar2 = local_298.shared_alloc_.alloc;
  if (((ulong)local_298.shared_alloc_.alloc & 7) == 0 &&
      local_298.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_298.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_298.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  check_collapse_exposure(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int)::$_0::
  ~__0((__0 *)&local_1c8);
  pAVar2 = local_328.shared_alloc_.alloc;
  if (((ulong)local_328.shared_alloc_.alloc & 7) == 0 &&
      local_328.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_328.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_328.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
    piVar1 = &local_1e8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1e8);
      operator_delete(local_1e8,0x48);
    }
  }
  if (((ulong)local_1d8._M_pi & 7) == 0 && (Alloc *)local_1d8._M_pi != (Alloc *)0x0) {
    p_Var9 = local_1d8._M_pi + 3;
    *(int *)&p_Var9->_vptr__Sp_counted_base = *(int *)&p_Var9->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var9->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_1d8._M_pi);
      operator_delete(local_1d8._M_pi,0x48);
    }
  }
  pAVar2 = local_310;
  if (((ulong)local_310 & 7) == 0 && local_310 != (Alloc *)0x0) {
    piVar1 = &local_310->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_310);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_300;
  if (((ulong)local_300 & 7) == 0 && local_300 != (Alloc *)0x0) {
    piVar1 = &local_300->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_300);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_2f0;
  if (((ulong)local_2f0 & 7) == 0 && local_2f0 != (Alloc *)0x0) {
    piVar1 = &local_2f0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2f0);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_2e0;
  if (((ulong)local_2e0 & 7) == 0 && local_2e0 != (Alloc *)0x0) {
    piVar1 = &local_2e0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2e0);
      operator_delete(pAVar2,0x48);
    }
  }
  Adj::~Adj(&local_60);
  RVar20.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar20.write_.shared_alloc_.alloc = local_2d0;
  return (Read<signed_char>)RVar20.write_.shared_alloc_;
}

Assistant:

Read<I8> check_collapse_exposure(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes, Int cell_dim) {
  auto e2c = mesh->ask_up(EDGE, cell_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto cs2s = mesh->ask_down(cell_dim, cell_dim - 1).ab2b;
  auto nccs = simplex_degree(cell_dim, cell_dim - 1);
  auto c2dim = mesh->get_array<I8>(cell_dim, "class_dim");
  auto s2dim = mesh->get_array<I8>(cell_dim - 1, "class_dim");
  auto ncands = cands2edges.size();
  auto cand_codes_w = Write<I8>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto code = cand_codes[cand];
    auto e = cands2edges[cand];
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto ec_code = ec_codes[ec];
      auto cce = code_which_down(ec_code);
      auto rot = code_rotation(ec_code);
      auto c_dim = c2dim[c];
      for (Int eev_col = 0; eev_col < 2; ++eev_col) {
        if (!collapses(code, eev_col)) continue;
        auto eev_onto = 1 - eev_col;
        auto cev_onto = rot ^ eev_onto;
        auto ccv_onto = simplex_down_template(cell_dim, EDGE, cce, cev_onto);
        auto ccs_opp = simplex_opposite_template(cell_dim, VERT, ccv_onto);
        auto s_opp = cs2s[c * nccs + ccs_opp];
        if (s2dim[s_opp] != c_dim) {
          code = dont_collapse(code, eev_col);
        }
      }
    }
    cand_codes_w[cand] = code;
  };
  parallel_for(ncands, f, "check_collapse_exposure");
  return cand_codes_w;
}